

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

int signature_compare(signature s,type_id ret,type_id *args,size_t size)

{
  type_id tVar1;
  ulong in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  type t;
  size_t iterator;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  type in_stack_ffffffffffffffc8;
  ulong local_30;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else if (in_RDI[2] == in_RCX) {
    tVar1 = type_index((type_conflict)*in_RDI);
    if (tVar1 == in_ESI) {
      for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
        in_stack_ffffffffffffffc8 =
             signature_get_type((signature)in_stack_ffffffffffffffc8,
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc4 = *(int *)(in_RDX + local_30 * 4);
        tVar1 = type_index(in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffc4 != tVar1) {
          return 1;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int signature_compare(signature s, type_id ret, type_id args[], size_t size)
{
	size_t iterator;

	if (s == NULL)
	{
		return 1;
	}

	if (s->count != size)
	{
		return 1;
	}

	if (type_index(s->ret) != ret)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = signature_get_type(s, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}